

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_expression::statement_expression
          (statement_expression *this,tree_type<cs::token_base_*> *tree,context_t *c,token_base *ptr
          )

{
  token_base *in_RDX;
  context_t *in_RSI;
  statement_base *in_RDI;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffff98;
  
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)in_RDX,in_stack_ffffffffffffff98);
  statement_base::statement_base(in_RDI,in_RSI,in_RDX);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x56b3b3);
  in_RDI->_vptr_statement_base = (_func_int **)&PTR__statement_expression_006cad38;
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)in_RDX,
             (tree_type<cs::token_base_*> *)in_stack_ffffffffffffff98);
  return;
}

Assistant:

statement_expression(tree_type<token_base *> tree, context_t c, token_base *ptr) : statement_base(std::move(c),
			        ptr),
			mTree(std::move(tree)) {}